

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O3

int ffikey(fitsfile *fptr,char *card,int *status)

{
  LONGLONG *pLVar1;
  undefined1 auVar2 [16];
  char *pcVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  size_t sVar8;
  __int32_t **pp_Var9;
  undefined1 *buffer;
  FITSfile *pFVar10;
  ulong uVar11;
  char *buffer_00;
  ulong uVar12;
  LONGLONG bytepos;
  char buff2 [81];
  char buff1 [81];
  char local_e8 [80];
  undefined1 local_98;
  undefined1 local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  buffer_00 = local_e8;
  pFVar10 = fptr->Fptr;
  if (fptr->HDUposition != pFVar10->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    pFVar10 = fptr->Fptr;
  }
  lVar7 = pFVar10->headend;
  if (pFVar10->datastart - lVar7 == 0x50) {
    iVar4 = ffiblk(fptr,1,0,status);
    if (0 < iVar4) goto LAB_0019a7ae;
    pFVar10 = fptr->Fptr;
    lVar7 = pFVar10->headend;
  }
  auVar2 = SEXT816(lVar7 - pFVar10->nextkey) * SEXT816(0x6666666666666667);
  strncpy(local_e8,card,0x50);
  local_98 = 0;
  sVar8 = strlen(local_e8);
  uVar5 = (uint)sVar8;
  if ((int)uVar5 < 1) {
LAB_0019a647:
    memset(local_e8 + (int)uVar5,0x20,(ulong)(0x4f - uVar5) + 1);
  }
  else {
    uVar11 = 0;
    do {
      if ((byte)(local_e8[uVar11] + 0x81U) < 0xa1) {
        local_e8[uVar11] = ' ';
      }
      uVar11 = uVar11 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar11);
    if ((int)uVar5 < 0x50) goto LAB_0019a647;
  }
  iVar4 = (int)(auVar2._8_8_ >> 5) - (auVar2._12_4_ >> 0x1f);
  sVar8 = strcspn(local_e8,"=");
  uVar11 = 8;
  uVar12 = sVar8 & 0xffffffff;
  if ((int)sVar8 == 0x50) {
    uVar12 = 8;
  }
  iVar6 = fits_strncasecmp("COMMENT ",local_e8,8);
  if (iVar6 == 0) {
LAB_0019a6ee:
    pp_Var9 = __ctype_toupper_loc();
    uVar12 = 0;
    do {
      local_e8[uVar12] = (char)(*pp_Var9)[local_e8[uVar12]];
      uVar12 = uVar12 + 1;
    } while (uVar11 != uVar12);
  }
  else {
    iVar6 = fits_strncasecmp("HISTORY ",local_e8,8);
    if (iVar6 == 0) goto LAB_0019a6ee;
    iVar6 = fits_strncasecmp("        ",local_e8,8);
    if (iVar6 == 0) goto LAB_0019a6ee;
    iVar6 = fits_strncasecmp("CONTINUE",local_e8,8);
    if ((iVar6 == 0) || (uVar11 = uVar12, 0 < (int)uVar12)) goto LAB_0019a6ee;
  }
  fftkey(local_e8,status);
  bytepos = fptr->Fptr->nextkey;
  ffmbyt(fptr,bytepos,0,status);
  if (0 < iVar4) {
    pcVar3 = local_e8;
    buffer = local_88;
    do {
      buffer_00 = buffer;
      buffer = pcVar3;
      ffgbyt(fptr,0x50,buffer_00,status);
      ffmbyt(fptr,bytepos,0,status);
      ffpbyt(fptr,0x50,buffer,status);
      bytepos = bytepos + 0x50;
      iVar4 = iVar4 + -1;
      pcVar3 = buffer_00;
    } while (iVar4 != 0);
  }
  ffpbyt(fptr,0x50,buffer_00,status);
  pFVar10 = fptr->Fptr;
  pLVar1 = &pFVar10->headend;
  *pLVar1 = *pLVar1 + 0x50;
  pLVar1 = &pFVar10->nextkey;
  *pLVar1 = *pLVar1 + 0x50;
LAB_0019a7ae:
  return *status;
}

Assistant:

int ffikey(fitsfile *fptr,    /* I - FITS file pointer  */
           const char *card,  /* I - card string value  */
           int *status)       /* IO - error status      */
/*
  insert a keyword at the position of (fptr->Fptr)->nextkey
*/
{
    int ii, len, nshift, keylength;
    long nblocks;
    LONGLONG bytepos;
    char *inbuff, *outbuff, *tmpbuff, buff1[FLEN_CARD], buff2[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ( ((fptr->Fptr)->datastart - (fptr->Fptr)->headend) == 80) /* only room for END card */
    {
        nblocks = 1;
        if (ffiblk(fptr, nblocks, 0, status) > 0) /* add new 2880-byte block*/
            return(*status);  
    }

    /* no. keywords to shift */
    nshift= (int) (( (fptr->Fptr)->headend - (fptr->Fptr)->nextkey ) / 80); 

    strncpy(buff2, card, 80);     /* copy card to output buffer */
    buff2[80] = '\0';

    len = strlen(buff2);

    /* silently replace any illegal characters with a space */
    for (ii=0; ii < len; ii++)   
        if (buff2[ii] < ' ' || buff2[ii] > 126) buff2[ii] = ' ';

    for (ii=len; ii < 80; ii++)   /* fill buffer with spaces if necessary */
        buff2[ii] = ' ';

    keylength = strcspn(buff2, "=");
    if (keylength == 80) keylength = 8;
    
    /* test for the common commentary keywords which by definition have 8-char names */
    if ( !fits_strncasecmp( "COMMENT ", buff2, 8) || !fits_strncasecmp( "HISTORY ", buff2, 8) ||
         !fits_strncasecmp( "        ", buff2, 8) || !fits_strncasecmp( "CONTINUE", buff2, 8) )
	 keylength = 8;

    for (ii=0; ii < keylength; ii++)       /* make sure keyword name is uppercase */
        buff2[ii] = toupper(buff2[ii]);

    fftkey(buff2, status);        /* test keyword name contains legal chars */

/*  no need to do this any more, since any illegal characters have been removed
    fftrec(buff2, status);  */      /* test rest of keyword for legal chars   */

    inbuff = buff1;
    outbuff = buff2;

    bytepos = (fptr->Fptr)->nextkey;           /* pointer to next keyword in header */
    ffmbyt(fptr, bytepos, REPORT_EOF, status);

    for (ii = 0; ii < nshift; ii++) /* shift each keyword down one position */
    {
        ffgbyt(fptr, 80, inbuff, status);   /* read the current keyword */

        ffmbyt(fptr, bytepos, REPORT_EOF, status); /* move back */
        ffpbyt(fptr, 80, outbuff, status);  /* overwrite with other buffer */

        tmpbuff = inbuff;   /* swap input and output buffers */
        inbuff = outbuff;
        outbuff = tmpbuff;

        bytepos += 80;
    }

    ffpbyt(fptr, 80, outbuff, status);  /* write the final keyword */

    (fptr->Fptr)->headend += 80; /* increment the position of the END keyword */
    (fptr->Fptr)->nextkey += 80; /* increment the pointer to next keyword */

    return(*status);
}